

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
Omega_h::get_dim_class_ids
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Int class_dim,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs)

{
  iterator __position;
  pointer pCVar1;
  int *__args;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (class_pairs->super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((class_pairs->super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    lVar3 = 4;
    uVar2 = 0;
    do {
      if (*(int *)((long)pCVar1 + lVar3 + -4) == class_dim) {
        __args = (int *)((long)&pCVar1->dim + lVar3);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar2 = uVar2 + 1;
      pCVar1 = (class_pairs->
               super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 8;
    } while (uVar2 < (ulong)((long)(class_pairs->
                                   super__Vector_base<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<LO> get_dim_class_ids(
    Int class_dim, std::vector<ClassPair> const& class_pairs) {
  std::vector<LO> dim_class_ids;
  for (size_t i = 0; i < class_pairs.size(); ++i) {
    if (class_pairs[i].dim == class_dim) {
      dim_class_ids.push_back(class_pairs[i].id);
    }
  }
  return dim_class_ids;
}